

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::DefineGroupNode::Emit(DefineGroupNode *this,Compiler *compiler,CharCount *skipped)

{
  CompilationScheme CVar1;
  uint uVar2;
  int iVar3;
  CharCount CVar4;
  uint uVar5;
  int iVar6;
  Node *pNVar7;
  CharSet<char16_t> *other;
  code *pcVar8;
  bool bVar9;
  char16 cVar10;
  undefined4 *puVar11;
  uint8 *puVar12;
  byte *pbVar13;
  
  ThreadContext::ProbeStackNoDispose
            (compiler->scriptContext->threadContext,0x6000,compiler->scriptContext,(PVOID)0x0);
  CVar1 = this->scheme;
  if (CVar1 == BeginEnd) {
    if (*skipped != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xd06,"(skipped == 0)","skipped == 0");
      if (!bVar9) {
LAB_00eb2448:
        pcVar8 = (code *)invalidInstructionException();
        (*pcVar8)();
      }
      *puVar11 = 0;
    }
    puVar12 = Compiler::Emit(compiler,5);
    iVar3 = this->groupId;
    *puVar12 = 'A';
    *(int *)(puVar12 + 1) = iVar3;
    (*this->body->_vptr_Node[0x11])(this->body,compiler,skipped);
    puVar12 = Compiler::Emit(compiler,6);
    iVar3 = this->groupId;
    bVar9 = this->noNeedToSave;
    *puVar12 = 'B';
    *(int *)(puVar12 + 1) = iVar3;
    puVar12[5] = bVar9;
  }
  else if (CVar1 == Fixed) {
    if ((this->body->thisConsumes).lower != (this->body->thisConsumes).upper) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xcf9,"(body->thisConsumes.IsFixed())","body->thisConsumes.IsFixed()");
      if (!bVar9) goto LAB_00eb2448;
      *puVar11 = 0;
    }
    (*this->body->_vptr_Node[0x11])(this->body,compiler,skipped);
    puVar12 = Compiler::Emit(compiler,10);
    iVar3 = this->groupId;
    CVar4 = (this->body->thisConsumes).lower;
    bVar9 = this->noNeedToSave;
    *puVar12 = 'C';
    *(int *)(puVar12 + 1) = iVar3;
    *(CharCount *)(puVar12 + 5) = CVar4;
    puVar12[9] = bVar9;
  }
  else if (CVar1 == Chomp) {
    if (this->body->tag != Loop) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xcd9,"(body->tag == NodeTag::Loop)","body->tag == NodeTag::Loop");
      if (!bVar9) goto LAB_00eb2448;
      *puVar11 = 0;
    }
    pNVar7 = this->body;
    other = (CharSet<char16_t> *)pNVar7[1]._vptr_Node[2];
    uVar2._0_2_ = pNVar7[1].tag;
    uVar2._2_2_ = pNVar7[1].features;
    if ((1 < uVar2) || (*(int *)&pNVar7[1].field_0xc != -1)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xcdd,"(repeats.lower <= 1 && repeats.IsUnbounded())",
                         "repeats.lower <= 1 && repeats.IsUnbounded()");
      if (!bVar9) goto LAB_00eb2448;
      *puVar11 = 0;
    }
    if ((other->rep).compact.countPlusOne != 2) {
      uVar5._0_2_ = pNVar7[1].tag;
      uVar5._2_2_ = pNVar7[1].features;
      if ((1 < uVar5) || (*(int *)&pNVar7[1].field_0xc != -1)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                           ,0xce8,"(repeats.lower <= 1 && repeats.IsUnbounded())",
                           "repeats.lower <= 1 && repeats.IsUnbounded()");
        if (!bVar9) goto LAB_00eb2448;
        *puVar11 = 0;
      }
      iVar3._0_2_ = pNVar7[1].tag;
      iVar3._2_2_ = pNVar7[1].features;
      pbVar13 = Compiler::Emit(compiler,0x2e);
      iVar6 = this->groupId;
      bVar9 = this->noNeedToSave;
      *pbVar13 = iVar3 == 0 ^ 0x59;
      RuntimeCharSet<char16_t>::RuntimeCharSet((RuntimeCharSet<char16_t> *)(pbVar13 + 1));
      *(int *)(pbVar13 + 0x29) = iVar6;
      pbVar13[0x2d] = bVar9;
      RuntimeCharSet<char16_t>::CloneFrom
                ((RuntimeCharSet<char16_t> *)(pbVar13 + 1),compiler->rtAllocator,other);
      return;
    }
    cVar10 = CharSet<char16_t>::Singleton(other);
    iVar6._0_2_ = pNVar7[1].tag;
    iVar6._2_2_ = pNVar7[1].features;
    puVar12 = Compiler::Emit(compiler,8);
    iVar3 = this->groupId;
    bVar9 = this->noNeedToSave;
    if (iVar6 == 0) {
      *puVar12 = 'V';
    }
    else {
      *puVar12 = 'W';
    }
    *(char16 *)(puVar12 + 1) = cVar10;
    *(int *)(puVar12 + 3) = iVar3;
    puVar12[7] = bVar9;
  }
  return;
}

Assistant:

void DefineGroupNode::Emit(Compiler& compiler, CharCount& skipped)
    {
        PROBE_STACK_NO_DISPOSE(compiler.scriptContext, Js::Constants::MinStackRegex);

        switch (scheme)
        {
            case Chomp:
            {
                // Compilation scheme:
                //
                //   Chomp(Char|Set)Group
                Assert(body->tag == NodeTag::Loop);
                const LoopNode *const loop = static_cast<const LoopNode *>(body);
                const CharSet<Char> *const loopBodyFirstSet = loop->body->firstSet;
                const CountDomain &repeats = loop->repeats;
                Assert(repeats.lower <= 1 && repeats.IsUnbounded());
                if(loopBodyFirstSet->IsSingleton())
                {
                    const Char c = loopBodyFirstSet->Singleton();
                    if(repeats.lower == 0)
                        EMIT(compiler, ChompCharGroupInst<ChompMode::Star>, c, groupId, noNeedToSave);
                    else
                        EMIT(compiler, ChompCharGroupInst<ChompMode::Plus>, c, groupId, noNeedToSave);
                }
                else
                {
                    Assert(repeats.lower <= 1 && repeats.IsUnbounded());
                    RuntimeCharSet<Char> *runtimeSet;
                    if(repeats.lower == 0)
                        runtimeSet = &EMIT(compiler, ChompSetGroupInst<ChompMode::Star>, groupId, noNeedToSave)->set;
                    else
                        runtimeSet = &EMIT(compiler, ChompSetGroupInst<ChompMode::Plus>, groupId, noNeedToSave)->set;
                    runtimeSet->CloneFrom(compiler.rtAllocator, *loopBodyFirstSet);
                }
                break;
            }

            case Fixed:
            {
                // Compilation scheme:
                //
                //   <body>
                //   DefineGroup
                Assert(body->thisConsumes.IsFixed());
                body->Emit(compiler, skipped);
                EMIT(compiler, DefineGroupFixedInst, groupId, body->thisConsumes.lower, noNeedToSave);
                break;
            }

            case BeginEnd:
            {
                // Compilation scheme:
                //
                //   BeginDefineGroup
                //   <body>
                //   EndDefineGroup
                Assert(skipped == 0);
                EMIT(compiler, BeginDefineGroupInst, groupId);
                body->Emit(compiler, skipped);
                EMIT(compiler, EndDefineGroupInst, groupId, noNeedToSave);
                break;
            }
        }
    }